

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

void slang::ast::GenerateBlockSymbol::fromSyntax
               (Compilation *compilation,IfGenerateSyntax *syntax,ASTContext *context,
               uint32_t constructIndex,bool isUninstantiated,
               SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *results)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes;
  bool bVar1;
  bool isUninstantiated_00;
  int iVar2;
  undefined4 extraout_var;
  ConstantValue cv;
  bool local_65;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  iVar2 = Expression::bind((int)(syntax->condition).ptr,(sockaddr *)context,0);
  ASTContext::eval((ConstantValue *)&local_58,context,(Expression *)CONCAT44(extraout_var,iVar2),
                   (bitmask<slang::ast::EvalFlags>)0x0);
  local_65 = true;
  if (local_58._M_index == '\0') {
    isUninstantiated_00 = true;
  }
  else {
    bVar1 = ASTContext::requireBooleanConvertible
                      (context,(Expression *)CONCAT44(extraout_var,iVar2));
    isUninstantiated_00 = true;
    if (bVar1 && !isUninstantiated) {
      local_65 = ConstantValue::isTrue((ConstantValue *)&local_58);
      isUninstantiated_00 = !local_65;
    }
  }
  attributes = &(syntax->super_MemberSyntax).attributes;
  createCondGenBlock(compilation,&((syntax->block).ptr)->super_SyntaxNode,context,constructIndex,
                     isUninstantiated_00,attributes,results);
  if (syntax->elseClause != (ElseClauseSyntax *)0x0) {
    createCondGenBlock(compilation,(syntax->elseClause->clause).ptr,context,constructIndex,local_65,
                       attributes,results);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_58);
  return;
}

Assistant:

void GenerateBlockSymbol::fromSyntax(Compilation& compilation, const IfGenerateSyntax& syntax,
                                     const ASTContext& context, uint32_t constructIndex,
                                     bool isUninstantiated,
                                     SmallVectorBase<GenerateBlockSymbol*>& results) {
    std::optional<bool> selector;
    auto& cond = Expression::bind(*syntax.condition, context);
    ConstantValue cv = context.eval(cond);
    if (cv && context.requireBooleanConvertible(cond) && !isUninstantiated)
        selector = cv.isTrue();

    createCondGenBlock(compilation, *syntax.block, context, constructIndex,
                       !selector.has_value() || !selector.value(), syntax.attributes, results);
    if (syntax.elseClause) {
        createCondGenBlock(compilation, *syntax.elseClause->clause, context, constructIndex,
                           !selector.has_value() || selector.value(), syntax.attributes, results);
    }
}